

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::AddCopy
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  pointer *pppvVar1;
  iterator __position;
  bool bVar2;
  void *__dest;
  void *copy;
  void *local_30;
  
  __dest = operator_new((long)size);
  local_30 = __dest;
  memcpy(__dest,encoded_file_descriptor,(long)size);
  __position._M_current =
       (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
              ((vector<void*,std::allocator<void*>> *)&this->files_to_delete_,__position,&local_30);
    __dest = local_30;
  }
  else {
    *__position._M_current = __dest;
    pppvVar1 = &(this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  bVar2 = Add(this,__dest,size);
  return bVar2;
}

Assistant:

bool EncodedDescriptorDatabase::AddCopy(const void* encoded_file_descriptor,
                                        int size) {
  void* copy = operator new(size);
  memcpy(copy, encoded_file_descriptor, size);
  files_to_delete_.push_back(copy);
  return Add(copy, size);
}